

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mraa.c
# Opt level: O2

int mraa_spi_lookup(char *spi_name)

{
  char *__s;
  mraa_board_t *pmVar1;
  int iVar2;
  ulong uVar3;
  size_t sVar4;
  ulong uVar5;
  
  pmVar1 = plat;
  if ((spi_name != (char *)0x0 && plat != (mraa_board_t *)0x0) && (*spi_name != '\0')) {
    uVar5 = 0;
    uVar3 = (ulong)(uint)plat->spi_bus_count;
    if (plat->spi_bus_count < 1) {
      uVar3 = uVar5;
    }
    for (; uVar3 * 0x28 - uVar5 != 0; uVar5 = uVar5 + 0x28) {
      __s = *(char **)((long)&pmVar1->spi_bus[0].name + uVar5);
      if (__s != (char *)0x0) {
        sVar4 = strlen(__s);
        iVar2 = strncmp(spi_name,__s,sVar4 + 1);
        if (iVar2 == 0) {
          return *(int *)((long)&pmVar1->spi_bus[0].bus_id + uVar5);
        }
      }
    }
  }
  return -1;
}

Assistant:

int
mraa_spi_lookup(const char* spi_name)
{
    int i;

    if (plat == NULL) {
        return -1;
    }

    if (spi_name == NULL || strlen(spi_name) == 0) {
        return -1;
    }

    for (i = 0; i < plat->spi_bus_count; i++) {
        if (plat->spi_bus[i].name != NULL &&
            strncmp(spi_name, plat->spi_bus[i].name, strlen(plat->spi_bus[i].name) + 1) == 0) {
            return plat->spi_bus[i].bus_id;
        }
    }
    return -1;
}